

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void fe::operations::
     applyOperationT<fe::operations::op_blend_one_invSrcAlpha,fe::PixelR8G8B8A8,fe::PixelA8>
               (op_blend_one_invSrcAlpha *op,PixelR8G8B8A8 *srcPixelFormat,PixelA8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint8_t *puVar6;
  int iVar7;
  byte *pbVar8;
  int y;
  int iVar9;
  uchar *destLine;
  byte *pbVar10;
  uchar *srcLine;
  uint8_t *puVar11;
  
  bVar3 = check(src,dest);
  if (bVar3) {
    puVar6 = (src->super_fe_image).data;
    pbVar8 = (dest->super_fe_image).data;
    iVar1 = (dest->super_fe_image).w;
    iVar2 = (dest->super_fe_image).h;
    for (iVar9 = 0; pbVar10 = pbVar8, puVar11 = puVar6, iVar7 = iVar1, iVar9 != iVar2;
        iVar9 = iVar9 + 1) {
      while (iVar7 != 0) {
        uVar5 = ((uint)(byte)~puVar11[3] * (uint)*pbVar10) / 0xff + (uint)puVar11[3];
        bVar4 = (byte)uVar5;
        if (0xfe < uVar5) {
          bVar4 = 0xff;
        }
        *pbVar10 = bVar4;
        pbVar10 = pbVar10 + (dest->super_fe_image).bytespp;
        puVar11 = puVar11 + (src->super_fe_image).bytespp;
        iVar7 = iVar7 + -1;
      }
      puVar6 = puVar6 + (src->super_fe_image).pitch;
      pbVar8 = pbVar8 + (dest->super_fe_image).pitch;
    }
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }